

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O3

int nghttp3_qpack_stream_add_ref(nghttp3_qpack_stream *stream,nghttp3_qpack_header_block_ref *ref)

{
  nghttp3_ringbuf *rb;
  ulong uVar1;
  int iVar2;
  undefined8 *puVar3;
  size_t nmemb;
  
  rb = &stream->refs;
  iVar2 = nghttp3_ringbuf_full(rb);
  if (iVar2 != 0) {
    uVar1 = (stream->refs).len * 2;
    nmemb = 4;
    if (4 < uVar1) {
      nmemb = uVar1;
    }
    iVar2 = nghttp3_ringbuf_reserve(rb,nmemb);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  iVar2 = nghttp3_pq_push(&stream->max_cnts,&ref->max_cnts_pe);
  if (iVar2 == 0) {
    puVar3 = (undefined8 *)nghttp3_ringbuf_push_back(rb);
    *puVar3 = ref;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int nghttp3_qpack_stream_add_ref(nghttp3_qpack_stream *stream,
                                 nghttp3_qpack_header_block_ref *ref) {
  nghttp3_qpack_header_block_ref **dest;
  int rv;

  if (nghttp3_ringbuf_full(&stream->refs)) {
    rv = nghttp3_ringbuf_reserve(
      &stream->refs,
      nghttp3_max_size(4, nghttp3_ringbuf_len(&stream->refs) * 2));
    if (rv != 0) {
      return rv;
    }
  }

  rv = nghttp3_pq_push(&stream->max_cnts, &ref->max_cnts_pe);
  if (rv != 0) {
    return rv;
  }

  dest = nghttp3_ringbuf_push_back(&stream->refs);
  *dest = ref;

  return 0;
}